

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O1

char * ucnv_io_stripEBCDICForCompare_63(char *dst,char *name)

{
  bool bVar1;
  char *pcVar2;
  byte bVar3;
  char *dstItr;
  bool bVar4;
  byte bVar5;
  
  pcVar2 = dst;
  bVar3 = *name;
  if (bVar3 == 0) {
LAB_0010d76e:
    *dst = 0;
    return pcVar2;
  }
  bVar1 = false;
LAB_0010d6f2:
  bVar4 = !bVar1;
  do {
    name = (char *)((byte *)name + 1);
    if ((char)bVar3 < '\0') {
      bVar5 = ""[bVar3 & 0x7f];
    }
    else {
      bVar5 = 0;
    }
    if (bVar5 != 0) {
      bVar1 = true;
      if (bVar5 != 1) {
        if (bVar5 != 2) {
          bVar1 = false;
          bVar3 = bVar5;
        }
        goto LAB_0010d763;
      }
      if (!bVar4) goto LAB_0010d763;
      if ((-1 < *name) || (1 < ""[(byte)*name & 0x7f] - 1)) goto LAB_0010d760;
    }
    bVar3 = *name;
    bVar4 = true;
  } while (bVar3 != 0);
  goto LAB_0010d76e;
LAB_0010d760:
  bVar1 = false;
LAB_0010d763:
  *dst = bVar3;
  dst = (char *)((byte *)dst + 1);
  bVar3 = *name;
  if (bVar3 == 0) goto LAB_0010d76e;
  goto LAB_0010d6f2;
}

Assistant:

U_CAPI char * U_CALLCONV
ucnv_io_stripEBCDICForCompare(char *dst, const char *name) {
    char *dstItr = dst;
    uint8_t type, nextType;
    char c1;
    UBool afterDigit = FALSE;

    while ((c1 = *name++) != 0) {
        type = GET_EBCDIC_TYPE(c1);
        switch (type) {
        case UIGNORE:
            afterDigit = FALSE;
            continue; /* ignore all but letters and digits */
        case ZERO:
            if (!afterDigit) {
                nextType = GET_EBCDIC_TYPE(*name);
                if (nextType == ZERO || nextType == NONZERO) {
                    continue; /* ignore leading zero before another digit */
                }
            }
            break;
        case NONZERO:
            afterDigit = TRUE;
            break;
        default:
            c1 = (char)type; /* lowercased letter */
            afterDigit = FALSE;
            break;
        }
        *dstItr++ = c1;
    }
    *dstItr = 0;
    return dst;
}